

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void Discover(void)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  Level in_stack_00000040;
  char (*in_stack_00000050) [9];
  char **in_stack_00000058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000060;
  sockaddr_in6 *s6;
  sockaddr_in *s4;
  ifaddrs *ifa;
  ifaddrs *myaddrs;
  CNetAddr addr_1;
  CNetAddr addr;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  CNetAddr *in_stack_fffffffffffffeb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  uint32_t in_stack_fffffffffffffec4;
  CNetAddr *in_stack_fffffffffffffec8;
  CNetAddr *in_stack_fffffffffffffee0;
  LogFlags in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 *local_d8;
  ConstevalFormatString<3U> in_stack_ffffffffffffff48;
  string_view in_stack_ffffffffffffff50;
  string_view in_stack_ffffffffffffff60;
  undefined8 *local_90;
  basic_string_view<char,_std::char_traits<char>_> local_88 [2];
  CNetAddr local_68;
  basic_string_view<char,_std::char_traits<char>_> local_48 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fDiscover) && (iVar2 = getifaddrs(&local_90), iVar2 == 0)) {
    for (local_d8 = local_90; local_d8 != (undefined8 *)0x0; local_d8 = (undefined8 *)*local_d8) {
      if (((local_d8[3] != 0) && ((*(uint *)(local_d8 + 2) & 1) != 0)) &&
         ((*(uint *)(local_d8 + 2) & 8) == 0)) {
        if (*(short *)local_d8[3] == 2) {
          CNetAddr::CNetAddr((CNetAddr *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                             (in_addr *)in_stack_fffffffffffffeb8);
          bVar1 = AddLocal((CNetAddr *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                           ,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
            in_stack_ffffffffffffff08 = 0;
            in_stack_fffffffffffffeb0 = (CNetAddr *)(local_d8 + 1);
            CNetAddr::ToStringAddr_abi_cxx11_(in_stack_fffffffffffffeb0);
            in_stack_fffffffffffffeb8 = local_48;
            in_stack_fffffffffffffe98 = 2;
            in_stack_fffffffffffffee0 = in_stack_fffffffffffffeb0;
            LogPrintFormatInternal<char[9],char*,std::__cxx11::string>
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff50,
                       (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),in_stack_ffffffffffffff00,
                       in_stack_00000040,in_stack_ffffffffffffff48,in_stack_00000050,
                       in_stack_00000058,in_stack_00000060);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          }
          CNetAddr::~CNetAddr((CNetAddr *)
                              CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        }
        else if (*(short *)local_d8[3] == 10) {
          in_stack_ffffffffffffff00 = local_d8[3];
          CNetAddr::CNetAddr(&local_68,(in6_addr *)in_stack_fffffffffffffec8,
                             in_stack_fffffffffffffec4);
          bVar1 = AddLocal((CNetAddr *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                           ,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
            in_stack_fffffffffffffeb0 = (CNetAddr *)(local_d8 + 1);
            CNetAddr::ToStringAddr_abi_cxx11_(in_stack_fffffffffffffee0);
            in_stack_fffffffffffffeb8 = local_88;
            in_stack_fffffffffffffe98 = 2;
            in_stack_fffffffffffffec8 = in_stack_fffffffffffffeb0;
            LogPrintFormatInternal<char[9],char*,std::__cxx11::string>
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff50,
                       (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),in_stack_ffffffffffffff00,
                       in_stack_00000040,in_stack_ffffffffffffff48,in_stack_00000050,
                       in_stack_00000058,in_stack_00000060);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          }
          CNetAddr::~CNetAddr((CNetAddr *)
                              CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        }
      }
    }
    freeifaddrs(local_90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Discover()
{
    if (!fDiscover)
        return;

#ifdef WIN32
    // Get local host IP
    char pszHostName[256] = "";
    if (gethostname(pszHostName, sizeof(pszHostName)) != SOCKET_ERROR)
    {
        const std::vector<CNetAddr> addresses{LookupHost(pszHostName, 0, true)};
        for (const CNetAddr& addr : addresses)
        {
            if (AddLocal(addr, LOCAL_IF))
                LogPrintf("%s: %s - %s\n", __func__, pszHostName, addr.ToStringAddr());
        }
    }
#elif (HAVE_DECL_GETIFADDRS && HAVE_DECL_FREEIFADDRS)
    // Get local host ip
    struct ifaddrs* myaddrs;
    if (getifaddrs(&myaddrs) == 0)
    {
        for (struct ifaddrs* ifa = myaddrs; ifa != nullptr; ifa = ifa->ifa_next)
        {
            if (ifa->ifa_addr == nullptr) continue;
            if ((ifa->ifa_flags & IFF_UP) == 0) continue;
            if ((ifa->ifa_flags & IFF_LOOPBACK) != 0) continue;
            if (ifa->ifa_addr->sa_family == AF_INET)
            {
                struct sockaddr_in* s4 = (struct sockaddr_in*)(ifa->ifa_addr);
                CNetAddr addr(s4->sin_addr);
                if (AddLocal(addr, LOCAL_IF))
                    LogPrintf("%s: IPv4 %s: %s\n", __func__, ifa->ifa_name, addr.ToStringAddr());
            }
            else if (ifa->ifa_addr->sa_family == AF_INET6)
            {
                struct sockaddr_in6* s6 = (struct sockaddr_in6*)(ifa->ifa_addr);
                CNetAddr addr(s6->sin6_addr);
                if (AddLocal(addr, LOCAL_IF))
                    LogPrintf("%s: IPv6 %s: %s\n", __func__, ifa->ifa_name, addr.ToStringAddr());
            }
        }
        freeifaddrs(myaddrs);
    }
#endif
}